

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O0

vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_> *
__thiscall relive::ReLiveDB::findTracksInfo(ReLiveDB *this,string *pattern,FindTracksFilter filter)

{
  is_equal_t<long_relive::Stream::*,_long_relive::Track::*> t_00;
  on_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,_long_relive::Track::*>_> o;
  bool bVar1;
  expression_t<long_relive::Stream::*> t_01;
  __tuple_element_t<5UL,_tuple<long,_basic_string<char>,_basic_string<char>,_basic_string<char>,_long,_int>_>
  *p_Var2;
  __tuple_element_t<1UL,_tuple<long,_basic_string<char>,_basic_string<char>,_basic_string<char>,_long,_int>_>
  *p_Var3;
  __tuple_element_t<2UL,_tuple<long,_basic_string<char>,_basic_string<char>,_basic_string<char>,_long,_int>_>
  *p_Var4;
  __tuple_element_t<3UL,_tuple<long,_basic_string<char>,_basic_string<char>,_basic_string<char>,_long,_int>_>
  *p_Var5;
  __tuple_element_t<4UL,_tuple<long,_basic_string<char>,_basic_string<char>,_basic_string<char>,_long,_int>_>
  *p_Var6;
  int in_ECX;
  string *in_RDX;
  vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
  *this_00;
  where_t<sqlite_orm::internal::or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
  *args_1;
  vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
  *in_RDI;
  binary_condition<long_relive::Stream::*,_long_relive::Track::*> bVar7;
  Type type;
  tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
  *t;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
  *__range1;
  vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
  select;
  lock_guard<std::recursive_mutex> lock;
  vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
  *result;
  mutex_type *in_stack_fffffffffffffc58;
  offset_in_Stream_to_long t_02;
  value_type *__x;
  expression_t<long_relive::Stream::*> in_stack_fffffffffffffc60;
  order_by_t<long_relive::Stream::*> *in_stack_fffffffffffffc68;
  string *psVar8;
  string *in_stack_fffffffffffffc70;
  offset_in_Track_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  in_stack_fffffffffffffc78;
  offset_in_Stream_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  in_stack_fffffffffffffc80;
  offset_in_Track_to_long in_stack_fffffffffffffc88;
  offset_in_Track_to_int in_stack_fffffffffffffca0;
  string local_328 [16];
  or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *in_stack_fffffffffffffce8;
  like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *in_stack_fffffffffffffcf0;
  like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *in_stack_fffffffffffffcf8;
  string local_2e8 [32];
  __tuple_element_t<4UL,_tuple<long,_basic_string<char>,_basic_string<char>,_basic_string<char>,_long,_int>_>
  local_2c8;
  int local_2bc;
  reference local_2b8;
  tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
  *local_2b0;
  __normal_iterator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_*,_std::vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>_>
  local_2a8;
  vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
  *local_2a0;
  undefined1 local_268 [128];
  string local_1e8 [288];
  offset_in_Stream_to_long local_c8;
  binary_condition<long_relive::Stream::*,_long_relive::Track::*> local_c0;
  binary_condition<long_relive::Stream::*,_long_relive::Track::*> local_b0;
  left_type local_a0;
  columns_t<long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  *in_stack_ffffffffffffff70;
  storage_t<_86c824a_> *in_stack_ffffffffffffff78;
  binary_condition<long_relive::Stream::*,_long_relive::Track::*> in_stack_ffffffffffffff80;
  order_by_t<long_relive::Stream::*> *in_stack_ffffffffffffffa0;
  vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
  local_48;
  byte local_29;
  int local_1c;
  string *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffc60.t,
             in_stack_fffffffffffffc58);
  local_29 = 0;
  std::vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>::
  vector((vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
          *)0x1693e1);
  storage_abi_cxx11_();
  t_02 = 0x50;
  sqlite_orm::
  columns<long_relive::Track::*,std::__cxx11::string_relive::Stream::*,std::__cxx11::string_relive::Track::*,std::__cxx11::string_relive::Track::*,long_relive::Stream::*,int_relive::Track::*>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             (offset_in_Track_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)
             in_stack_fffffffffffffc70,(offset_in_Stream_to_long)in_stack_fffffffffffffc68,
             in_stack_fffffffffffffca0);
  t_01 = sqlite_orm::c<long_relive::Stream::*>(t_02);
  local_c8 = t_01.t;
  local_c0 = (binary_condition<long_relive::Stream::*,_long_relive::Track::*>)
             sqlite_orm::operator==(in_stack_fffffffffffffc60,t_02);
  t_00.super_binary_condition<long_relive::Stream::*,_long_relive::Track::*>.r =
       (right_type)in_stack_fffffffffffffc70;
  t_00.super_binary_condition<long_relive::Stream::*,_long_relive::Track::*>.l =
       (left_type)in_stack_fffffffffffffc68;
  local_b0 = (binary_condition<long_relive::Stream::*,_long_relive::Track::*>)
             sqlite_orm::
             on<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,long_relive::Track::*>>
                       (t_00);
  this_00 = (vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
             *)local_b0.r;
  o.arg.super_binary_condition<long_relive::Stream::*,_long_relive::Track::*>.r =
       (right_type)in_stack_fffffffffffffc70;
  o.arg.super_binary_condition<long_relive::Stream::*,_long_relive::Track::*>.l =
       (left_type)in_stack_fffffffffffffc68;
  bVar7 = (binary_condition<long_relive::Stream::*,_long_relive::Track::*>)
          sqlite_orm::
          inner_join<relive::Stream,sqlite_orm::internal::on_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,long_relive::Track::*>>>
                    (o);
  args_1 = (where_t<sqlite_orm::internal::or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
            *)bVar7.r;
  local_a0 = bVar7.l;
  std::__cxx11::string::string(local_1e8,local_18);
  sqlite_orm::like<std::__cxx11::string_relive::Track::*,std::__cxx11::string>
            ((offset_in_Track_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)
             in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t_01.t);
  std::__cxx11::string::string((string *)(local_268 + 0x30),local_18);
  sqlite_orm::like<std::__cxx11::string_relive::Track::*,std::__cxx11::string>
            ((offset_in_Track_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)
             in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t_01.t);
  sqlite_orm::operator||(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  sqlite_orm::
  where<sqlite_orm::internal::or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::string_relive::Track::*,std::__cxx11::string,void>,sqlite_orm::internal::like_t<std::__cxx11::string_relive::Track::*,std::__cxx11::string,void>>>
            (in_stack_fffffffffffffce8);
  sqlite_orm::order_by<long_relive::Stream::*>(t_02);
  sqlite_orm::internal::order_by_t<long_relive::Stream::*>::desc(in_stack_fffffffffffffc68);
  __x = (value_type *)local_268;
  sqlite_orm::internal::storage_t<$86c824a$>::
  select<sqlite_orm::internal::columns_t<long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>,_sqlite_orm::internal::inner_join_t<relive::Stream,_sqlite_orm::internal::on_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,_long_relive::Track::*>_>_>,_sqlite_orm::internal::where_t<sqlite_orm::internal::or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>,_sqlite_orm::internal::order_by_t<long_relive::Stream::*>,_std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (inner_join_t<relive::Stream,_sqlite_orm::internal::on_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,_long_relive::Track::*>_>_>
              )in_stack_ffffffffffffff80,args_1,in_stack_ffffffffffffffa0);
  sqlite_orm::internal::order_by_t<long_relive::Stream::*>::~order_by_t
            ((order_by_t<long_relive::Stream::*> *)0x169601);
  sqlite_orm::internal::order_by_t<long_relive::Stream::*>::~order_by_t
            ((order_by_t<long_relive::Stream::*> *)0x16960e);
  sqlite_orm::internal::
  where_t<sqlite_orm::internal::or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
  ::~where_t((where_t<sqlite_orm::internal::or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
              *)0x16961b);
  sqlite_orm::internal::
  or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~or_condition_t((or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                     *)0x169628);
  sqlite_orm::internal::
  like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::~like_t((like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             *)0x169635);
  std::__cxx11::string::~string((string *)(local_268 + 0x30));
  sqlite_orm::internal::
  like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::~like_t((like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             *)0x16964f);
  std::__cxx11::string::~string(local_1e8);
  std::
  vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
  ::size(&local_48);
  std::vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>::
  reserve(this_00,bVar7.l);
  local_2a0 = &local_48;
  local_2a8._M_current =
       (tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
        *)std::
          vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
          ::begin((vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
                   *)__x);
  local_2b0 = (tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
               *)std::
                 vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
                 ::end((vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
                        *)__x);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_*,_std::vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>_>
                        *)in_stack_fffffffffffffc60.t,
                       (__normal_iterator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_*,_std::vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>_>
                        *)__x);
    if (!bVar1) break;
    local_2b8 = __gnu_cxx::
                __normal_iterator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_*,_std::vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>_>
                ::operator*(&local_2a8);
    p_Var2 = std::
             get<5ul,long,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long,int>
                       ((tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                         *)0x1696f2);
    local_2bc = *p_Var2;
    if ((((local_1c == 0) || ((local_1c == 1 && (local_2bc == 1)))) ||
        ((local_1c == 2 && (local_2bc == 3)))) ||
       ((local_1c == 3 && ((local_2bc == 2 || (local_2bc == 4)))))) {
      std::get<0ul,long,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long,int>
                ((tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                  *)0x169760);
      psVar8 = local_328;
      p_Var3 = std::
               get<1ul,long,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long,int>
                         ((tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                           *)0x169782);
      std::__cxx11::string::string(psVar8,(string *)p_Var3);
      in_stack_fffffffffffffc70 = (string *)&stack0xfffffffffffffcf8;
      p_Var4 = std::
               get<2ul,long,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long,int>
                         ((tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                           *)0x1697ab);
      std::__cxx11::string::string(in_stack_fffffffffffffc70,(string *)p_Var4);
      psVar8 = local_2e8;
      p_Var5 = std::
               get<3ul,long,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long,int>
                         ((tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                           *)0x1697d4);
      std::__cxx11::string::string(psVar8,(string *)p_Var5);
      p_Var6 = std::
               get<4ul,long,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long,int>
                         ((tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                           *)0x1697f0);
      local_2c8 = *p_Var6;
      std::
      vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>::
      push_back((vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
                 *)in_stack_fffffffffffffc60.t,__x);
      FindTracksInfo::~FindTracksInfo((FindTracksInfo *)in_stack_fffffffffffffc60.t);
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_*,_std::vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>_>
    ::operator++(&local_2a8);
  }
  local_29 = 1;
  std::
  vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
  ::~vector((vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
             *)in_stack_fffffffffffffc70);
  if ((local_29 & 1) == 0) {
    std::vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
    ::~vector((vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
               *)in_stack_fffffffffffffc70);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x169a2f);
  return in_RDI;
}

Assistant:

std::vector<ReLiveDB::FindTracksInfo> ReLiveDB::findTracksInfo(const std::string& pattern, FindTracksFilter filter)
{
    std::lock_guard<Mutex> lock{_mutex};
    std::vector<FindTracksInfo> result;
    auto select = storage().select(columns(&Track::_id, &Stream::_name, &Track::_artist, &Track::_name, &Stream::_timestamp, &Track::_type), inner_join<Stream>(on(c(&Stream::_id) == &Track::_streamId)),
                                   where(like(&Track::_name, pattern) or like(&Track::_artist, pattern)), order_by(&Stream::_timestamp).desc());
    result.reserve(select.size());
    for (auto& t : select) {
        auto type = static_cast<Track::Type>(std::get<5>(t));
        if (filter == eNone || (filter == eTracks && type == Track::eMusic) || (filter == eJingle && type == Track::eJingle) || (filter == eNarration && (type == Track::eConversation || type == Track::eNarration))) {
            result.push_back({std::get<0>(t), std::get<1>(t), std::get<2>(t), std::get<3>(t), std::get<4>(t)});
        }
    }
    return result;
}